

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtSphereShape.cpp
# Opt level: O2

cbtVector3 __thiscall cbtSphereShape::localGetSupportingVertex(cbtSphereShape *this,cbtVector3 *vec)

{
  float fVar1;
  undefined8 in_XMM0_Qa;
  float in_XMM1_Da;
  cbtVector3 cVar2;
  cbtVector3 local_48;
  float local_38;
  undefined8 local_28;
  
  local_38 = in_XMM1_Da;
  (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0x11])();
  local_48.m_floats._0_8_ = *(undefined8 *)vec->m_floats;
  local_48.m_floats._8_8_ = *(undefined8 *)(vec->m_floats + 2);
  local_28 = in_XMM0_Qa;
  fVar1 = cbtVector3::length2(&local_48);
  if (fVar1 < 1.4210855e-14) {
    fVar1 = -1.0;
    local_48.m_floats[0] = -1.0;
    local_48.m_floats[1] = -1.0;
    local_48.m_floats[2] = -1.0;
    local_48.m_floats[3] = 0.0;
  }
  cbtVector3::normalize(&local_48);
  (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xc])(this);
  cVar2.m_floats[0] = fVar1 * local_48.m_floats[0] + (float)local_28;
  cVar2.m_floats[1] = fVar1 * local_48.m_floats[1] + local_28._4_4_;
  cVar2.m_floats[2] = local_38 + fVar1 * local_48.m_floats[2];
  cVar2.m_floats[3] = 0.0;
  return (cbtVector3)cVar2.m_floats;
}

Assistant:

cbtVector3 cbtSphereShape::localGetSupportingVertex(const cbtVector3& vec) const
{
	cbtVector3 supVertex;
	supVertex = localGetSupportingVertexWithoutMargin(vec);

	cbtVector3 vecnorm = vec;
	if (vecnorm.length2() < (SIMD_EPSILON * SIMD_EPSILON))
	{
		vecnorm.setValue(cbtScalar(-1.), cbtScalar(-1.), cbtScalar(-1.));
	}
	vecnorm.normalize();
	supVertex += getMargin() * vecnorm;
	return supVertex;
}